

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cache.cpp
# Opt level: O2

void __thiscall duckdb::VectorCacheBuffer::~VectorCacheBuffer(VectorCacheBuffer *this)

{
  (this->super_VectorBuffer)._vptr_VectorBuffer = (_func_int **)&PTR__VectorCacheBuffer_01776098;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->auxiliary).internal.
              super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::
  vector<duckdb::shared_ptr<duckdb::VectorBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>_>
  ::~vector(&(this->child_caches).
             super_vector<duckdb::shared_ptr<duckdb::VectorBuffer,_true>,_std::allocator<duckdb::shared_ptr<duckdb::VectorBuffer,_true>_>_>
           );
  AllocatedData::~AllocatedData(&this->owned_data);
  LogicalType::~LogicalType(&this->type);
  VectorBuffer::~VectorBuffer(&this->super_VectorBuffer);
  return;
}

Assistant:

explicit VectorCacheBuffer(Allocator &allocator, const LogicalType &type_p, idx_t capacity_p = STANDARD_VECTOR_SIZE)
	    : VectorBuffer(VectorBufferType::OPAQUE_BUFFER), type(type_p), capacity(capacity_p) {
		auto internal_type = type.InternalType();
		switch (internal_type) {
		case PhysicalType::LIST: {
			// memory for the list offsets
			owned_data = allocator.Allocate(capacity * GetTypeIdSize(internal_type));
			// child data of the list
			auto &child_type = ListType::GetChildType(type);
			child_caches.push_back(make_buffer<VectorCacheBuffer>(allocator, child_type, capacity));
			auto child_vector = make_uniq<Vector>(child_type, false, false);
			auxiliary = make_shared_ptr<VectorListBuffer>(std::move(child_vector));
			break;
		}
		case PhysicalType::ARRAY: {
			auto &child_type = ArrayType::GetChildType(type);
			auto array_size = ArrayType::GetSize(type);
			child_caches.push_back(make_buffer<VectorCacheBuffer>(allocator, child_type, array_size * capacity));
			auto child_vector = make_uniq<Vector>(child_type, true, false, array_size * capacity);
			auxiliary = make_shared_ptr<VectorArrayBuffer>(std::move(child_vector), array_size, capacity);
			break;
		}
		case PhysicalType::STRUCT: {
			auto &child_types = StructType::GetChildTypes(type);
			for (auto &child_type : child_types) {
				child_caches.push_back(make_buffer<VectorCacheBuffer>(allocator, child_type.second, capacity));
			}
			auto struct_buffer = make_shared_ptr<VectorStructBuffer>(type);
			auxiliary = std::move(struct_buffer);
			break;
		}
		default:
			owned_data = allocator.Allocate(capacity * GetTypeIdSize(internal_type));
			break;
		}
	}